

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ea409::ValueSetter::ValueSetter
          (ValueSetter *this,string *DA,string *V,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *opt,double tf,Rectangle *bbox)

{
  Rectangle *bbox_local;
  double tf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *opt_local;
  string *V_local;
  string *DA_local;
  ValueSetter *this_local;
  
  QPDFObjectHandle::TokenFilter::TokenFilter(&this->super_TokenFilter);
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__ValueSetter_005925d0;
  std::__cxx11::string::string((string *)&this->DA,(string *)DA);
  std::__cxx11::string::string((string *)&this->V,(string *)V);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->opt,opt);
  this->tf = tf;
  (this->bbox).llx = bbox->llx;
  (this->bbox).lly = bbox->lly;
  (this->bbox).urx = bbox->urx;
  (this->bbox).ury = bbox->ury;
  this->state = st_top;
  this->replaced = false;
  return;
}

Assistant:

ValueSetter::ValueSetter(
    std::string const& DA,
    std::string const& V,
    std::vector<std::string> const& opt,
    double tf,
    QPDFObjectHandle::Rectangle const& bbox) :
    DA(DA),
    V(V),
    opt(opt),
    tf(tf),
    bbox(bbox)
{
}